

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_out_in_init_high(APITests *this)

{
  long in_RDI;
  int val;
  allocator local_91;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  allocator in_stack_ffffffffffffff97;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,1);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  local_c = GPIO::input(*(int *)(in_RDI + 0x24));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  assert::is_true((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GPIO::output(*(int *)(in_RDI + 0x20),0);
  local_c = GPIO::input(*(int *)(in_RDI + 0x24));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",(allocator *)&stack0xffffffffffffff97);
  assert::is_true((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  GPIO::output(*(int *)(in_RDI + 0x20),1);
  local_c = GPIO::input(*(int *)(in_RDI + 0x24));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  assert::is_true((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  GPIO::cleanup();
  return;
}

Assistant:

void test_out_in_init_high()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::output(pin_data.out_a, GPIO::LOW);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::LOW);

        GPIO::output(pin_data.out_a, GPIO::HIGH);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }